

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

array<char,_22UL> *
convertToPrintString(array<char,_22UL> *__return_storage_ptr__,double val,char *trailingStr)

{
  int iVar1;
  undefined4 extraout_var;
  char *__format;
  double dVar2;
  
  __return_storage_ptr__->_M_elems[0] = '\0';
  __return_storage_ptr__->_M_elems[1] = '\0';
  __return_storage_ptr__->_M_elems[2] = '\0';
  __return_storage_ptr__->_M_elems[3] = '\0';
  __return_storage_ptr__->_M_elems[4] = '\0';
  __return_storage_ptr__->_M_elems[5] = '\0';
  __return_storage_ptr__->_M_elems[6] = '\0';
  __return_storage_ptr__->_M_elems[7] = '\0';
  __return_storage_ptr__->_M_elems[8] = '\0';
  __return_storage_ptr__->_M_elems[9] = '\0';
  __return_storage_ptr__->_M_elems[10] = '\0';
  __return_storage_ptr__->_M_elems[0xb] = '\0';
  __return_storage_ptr__->_M_elems[0xc] = '\0';
  __return_storage_ptr__->_M_elems[0xd] = '\0';
  __return_storage_ptr__->_M_elems[0xe] = '\0';
  __return_storage_ptr__->_M_elems[0xf] = '\0';
  __return_storage_ptr__->_M_elems[0xe] = '\0';
  __return_storage_ptr__->_M_elems[0xf] = '\0';
  __return_storage_ptr__->_M_elems[0x10] = '\0';
  __return_storage_ptr__->_M_elems[0x11] = '\0';
  __return_storage_ptr__->_M_elems[0x12] = '\0';
  __return_storage_ptr__->_M_elems[0x13] = '\0';
  __return_storage_ptr__->_M_elems[0x14] = '\0';
  __return_storage_ptr__->_M_elems[0x15] = '\0';
  if (ABS(val) == INFINITY) {
    __format = "%.10g%s";
  }
  else {
    dVar2 = ABS(val);
    if (dVar2 <= 1e-06) {
      dVar2 = 1e-06;
    }
    dVar2 = log10(dVar2);
    if ((uint)(int)dVar2 < 0xb) {
      __format = &DAT_003cf2b0 + *(int *)(&DAT_003cf2b0 + (ulong)(uint)(int)dVar2 * 4);
    }
    else {
      __format = "%.9g%s";
    }
  }
  iVar1 = snprintf(__return_storage_ptr__->_M_elems,0x16,__format,val,trailingStr);
  return (array<char,_22UL> *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static std::array<char, 22> convertToPrintString(double val,
                                                 const char* trailingStr = "") {
  decltype(convertToPrintString(std::declval<double>(),
                                std::declval<char*>())) printString = {};
  double l = std::abs(val) == kHighsInf
                 ? 0.0
                 : std::log10(std::max(1e-6, std::abs(val)));
  switch (int(l)) {
    case 0:
    case 1:
    case 2:
    case 3:
      std::snprintf(printString.data(), printString.size(), "%.10g%s", val,
                    trailingStr);
      break;
    case 4:
      std::snprintf(printString.data(), printString.size(), "%.11g%s", val,
                    trailingStr);
      break;
    case 5:
      std::snprintf(printString.data(), printString.size(), "%.12g%s", val,
                    trailingStr);
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
      std::snprintf(printString.data(), printString.size(), "%.13g%s", val,
                    trailingStr);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%.9g%s", val,
                    trailingStr);
  }

  return printString;
}